

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestRules::Run(ParserTestRules *this)

{
  int iVar1;
  Rule *this_00;
  Test *pTVar2;
  bool bVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar4;
  EvalString *this_01;
  BindingEnv *this_02;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\n\nrule date\n  command = date > $out\n\nbuild result: cat in_1.cc in-2.O\n"
            );
  pTVar2 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    this_02 = &(this->super_ParserTest).state.bindings_;
    pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_02);
    bVar3 = testing::Test::Check
                      (pTVar2,(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                       ,0x35,"3u == state.bindings_.GetRules().size()");
    if (bVar3) {
      pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_02);
      pTVar2 = g_current_test;
      this_00 = *(Rule **)((pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 2);
      bVar3 = std::operator==("cat",&this_00->name_);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x37,"\"cat\" == rule->name()");
      pTVar2 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"command",&local_61);
      this_01 = Rule::GetBinding(this_00,&local_40);
      EvalString::Serialize_abi_cxx11_(&local_60,this_01);
      bVar3 = std::operator==("[cat ][$in][ > ][$out]",&local_60);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x39,"\"[cat ][$in][ > ][$out]\" == rule->GetBinding(\"command\")->Serialize()");
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, Rules) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"\n"
"rule date\n"
"  command = date > $out\n"
"\n"
"build result: cat in_1.cc in-2.O\n"));

  ASSERT_EQ(3u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("cat", rule->name());
  EXPECT_EQ("[cat ][$in][ > ][$out]",
            rule->GetBinding("command")->Serialize());
}